

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Cues::AddCue(Cues *this,CuePoint *cue)

{
  int iVar1;
  uint uVar2;
  CuePoint **ppCVar3;
  bool bVar4;
  CuePoint **ppCVar5;
  ulong uVar6;
  uint uVar7;
  
  if (cue == (CuePoint *)0x0) {
    return false;
  }
  iVar1 = this->cue_entries_capacity_;
  uVar2 = this->cue_entries_size_;
  if ((int)uVar2 < iVar1) {
LAB_001506fb:
    cue->output_block_number_ = this->output_block_number_;
    iVar1 = this->cue_entries_size_;
    this->cue_entries_size_ = iVar1 + 1;
    this->cue_entries_[iVar1] = cue;
    bVar4 = true;
  }
  else {
    uVar7 = 2;
    if (iVar1 != 0) {
      uVar7 = iVar1 * 2;
    }
    if (0 < (int)uVar7) {
      ppCVar5 = (CuePoint **)operator_new__((ulong)uVar7 << 3,(nothrow_t *)&std::nothrow);
      if (ppCVar5 != (CuePoint **)0x0) {
        if (0 < (int)uVar2) {
          ppCVar3 = this->cue_entries_;
          uVar6 = 0;
          do {
            ppCVar5[uVar6] = ppCVar3[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        if (this->cue_entries_ != (CuePoint **)0x0) {
          operator_delete__(this->cue_entries_);
        }
        this->cue_entries_ = ppCVar5;
        this->cue_entries_capacity_ = uVar7;
        goto LAB_001506fb;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Cues::AddCue(CuePoint* cue) {
  if (!cue)
    return false;

  if ((cue_entries_size_ + 1) > cue_entries_capacity_) {
    // Add more CuePoints.
    const int32_t new_capacity =
        (!cue_entries_capacity_) ? 2 : cue_entries_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    CuePoint** const cues =
        new (std::nothrow) CuePoint*[new_capacity];  // NOLINT
    if (!cues)
      return false;

    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      cues[i] = cue_entries_[i];
    }

    delete[] cue_entries_;

    cue_entries_ = cues;
    cue_entries_capacity_ = new_capacity;
  }

  cue->set_output_block_number(output_block_number_);
  cue_entries_[cue_entries_size_++] = cue;
  return true;
}